

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,LengthExpression *expression)

{
  int iVar1;
  Value *pVVar2;
  ArrayValue *this_00;
  PrimitiveSimpleObject *this_01;
  Type *this_02;
  allocator<char> local_99;
  VariableValue *local_98;
  string local_90;
  Symbol local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_70,&local_50);
  iVar1 = FunctionTable::Get(&this->table_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pVVar2 = FrameEmulator::Get(&this->frame_,iVar1);
  this_00 = (ArrayValue *)__dynamic_cast(pVVar2,&Value::typeinfo,&ArrayValue::typeinfo,0);
  iVar1 = ArrayValue::GetSize(this_00);
  local_98 = (VariableValue *)operator_new(0x50);
  this_01 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_02 = (Type *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"int",&local_99);
  Type::Type(this_02,&local_90);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_01,this_02);
  VariableValue::VariableValue(local_98,this_01,iVar1);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = &local_98->super_Value;
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LengthExpression* expression) {
  int index = table_.Get(Symbol(expression->variable_name_));
  int size = dynamic_cast<ArrayValue*>(frame_.Get(index))->GetSize();
  tos_value_ =
      new VariableValue(new PrimitiveSimpleObject(new Type("int")), size);
}